

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_GetSetBGR_Test::TestBody(Image_GetSetBGR_Test *this)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Allocator alloc;
  ulong uVar3;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  int x;
  int c_00;
  ulong uVar5;
  char *pcVar6;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar7
  ;
  ColorEncodingHandle *encoding;
  Point2i PVar8;
  int c;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  AssertionResult gtest_ar_1;
  Float local_2b8 [2];
  AssertHelper local_2b0;
  ulong local_2a8;
  PixelFormat local_29c;
  ulong local_298;
  ulong local_290;
  Float qv;
  size_t *local_280;
  size_t *local_278;
  ulong local_270;
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ImageChannelValues rgb;
  string local_1f8 [32];
  long local_1d8;
  long local_1d0;
  WrapMode2D local_1c8;
  WrapMode2D local_1c0;
  WrapMode2D local_1b8;
  ColorEncodingHandle local_1b0;
  PixelFormat local_1a4 [3];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageChannelDesc bgrDesc;
  Image image;
  
  GetFloatPixels(&rgbPixels,(Point2i)0x2000000007,3);
  local_1a4[0] = U256;
  local_1a4[1] = Half;
  local_280 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc;
  local_1a4[2] = 2;
  lVar9 = 0;
  local_278 = local_280;
  do {
    if (lVar9 == 0xc) {
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbPixels);
      return;
    }
    local_1d8 = lVar9;
    local_29c = *(PixelFormat *)((long)local_1a4 + lVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rgb,"R",(allocator<char> *)&bgrDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
               "G",(allocator<char> *)&gtest_ar_);
    std::__cxx11::string::string<std::allocator<char>>(local_1f8,"B",(allocator<char> *)&gtest_ar_1)
    ;
    local_1b0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_1b0;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgb;
    pbrt::Image::Image(&image,local_29c,(Point2i)0x2000000007,channels,encoding,alloc);
    lVar9 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                         .alloc.memoryResource + lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    uVar10 = 0;
    uVar3 = 0;
    while (uVar3 != 0x20) {
      local_2a8 = uVar3 << 0x20;
      local_298 = uVar10;
      local_290 = uVar3;
      for (uVar5 = 0; uVar5 != 7; uVar5 = uVar5 + 1) {
        PVar8.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_2a8 | uVar5);
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          pbrt::Image::SetChannel
                    (&image,PVar8,(int)lVar9,*(Float *)((long)rgbPixels.ptr + lVar9 * 4 + uVar10));
        }
        uVar10 = uVar10 + 0xc;
      }
      uVar10 = local_298 + 0x54;
      uVar3 = local_290 + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rgb,"B",(allocator<char> *)&gtest_ar_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
               "G",(allocator<char> *)&gtest_ar_1);
    std::__cxx11::string::string<std::allocator<char>>(local_1f8,"R",(allocator<char> *)local_2b8);
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgb;
    pbrt::Image::GetChannelDesc(&bgrDesc,&image,requestedChannels);
    lVar9 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                         .alloc.memoryResource + lVar9));
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = bgrDesc.offset.nStored != 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&rgb,(internal *)&gtest_ar_,(AssertionResult *)"bool(bgrDesc)","false",
                 "true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0xc0,(char *)rgb.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .alloc.memoryResource);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
      std::__cxx11::string::~string((string *)&rgb);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    local_270 = 0;
    lVar9 = 0;
    while (lVar9 != 0x20) {
      local_290 = lVar9 << 0x20;
      local_2a8 = local_270;
      uVar3 = 0;
      local_1d0 = lVar9;
      while( true ) {
        if (uVar3 == 7) break;
        local_298 = uVar3;
        pbrt::WrapMode2D::WrapMode2D(&local_1b8,Clamp);
        PVar8.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_290 | local_298);
        pbrt::Image::GetChannels(&rgb,&image,PVar8,local_1b8);
        local_2b8[0] = 4.2039e-45;
        gtest_ar_1._0_8_ =
             rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar_,"3","rgb.size()",(int *)local_2b8,
                   (unsigned_long *)&gtest_ar_1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_1);
          pcVar6 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xc5,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b8,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        pbrt::WrapMode2D::WrapMode2D(&local_1c0,Clamp);
        pbrt::Image::GetChannels((ImageChannelValues *)&gtest_ar_,&image,PVar8,&bgrDesc,local_1c0);
        paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar4 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        sVar7 = gtest_ar_.message_;
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = &local_258;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar_1,"rgb[0]","bgr[2]",paVar4->fixed,
                   (float *)&(sVar7.ptr_)->_M_string_length);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)local_2b8);
          pcVar6 = "";
          if (gtest_ar_1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,200,pcVar6);
          testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2b8);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2b8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar4 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar2 = &local_258;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar_1,"rgb[1]","bgr[1]",paVar4->fixed + 1,
                   (float *)((long)&(pbVar2->_M_dataplus)._M_p + 4));
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)local_2b8);
          pcVar6 = "";
          if (gtest_ar_1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xc9,pcVar6);
          testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2b8);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2b8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar4 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        sVar7 = gtest_ar_.message_;
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar7.ptr_ = &local_258;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar_1,"rgb[2]","bgr[0]",paVar4->fixed + 2,(float *)sVar7.ptr_);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)local_2b8);
          pcVar6 = "";
          if (gtest_ar_1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xca,pcVar6);
          testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2b8);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2b8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        c_00 = 0;
        for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 4) {
          paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                    *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      ptr;
          if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
              (float *)0x0) {
            paVar4 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
          }
          pbrt::WrapMode2D::WrapMode2D(&local_1c8,Clamp);
          local_2b8[0] = pbrt::Image::GetChannel(&image,PVar8,c_00,local_1c8);
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&gtest_ar_1,"rgb[c]","image.GetChannel({x, y}, c)",
                     (float *)((long)paVar4 + lVar9),(float *)local_2b8);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)local_2b8);
            pcVar6 = "";
            if (gtest_ar_1.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xcd,pcVar6);
            testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2b8);
            testing::internal::AssertHelper::~AssertHelper(&local_2b0);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_2b8);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_1.message_);
          if (local_29c == U256) {
            paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                      *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        ptr;
            if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
                (float *)0x0) {
              paVar4 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        field_2;
            }
            local_2b0.data_._0_4_ = 0x3b00c24b;
            auVar12 = ZEXT416(*(uint *)((long)rgbPixels.ptr + lVar9 + local_2a8));
            auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
            uVar1 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,1);
            auVar12._8_4_ = 0x7fffffff;
            auVar12._0_8_ = 0x7fffffff7fffffff;
            auVar12._12_4_ = 0x7fffffff;
            auVar11 = vandps_avx512vl(ZEXT416((uint)(*(float *)((long)paVar4 + lVar9) -
                                                    (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                           auVar11._0_4_))),auVar12);
            local_2b8[0] = auVar11._0_4_;
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&gtest_ar_1,"std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1))",
                       "0.501f / 255.f",(float *)local_2b8,(float *)&local_2b0);
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)local_2b8);
              pcVar6 = "";
              if (gtest_ar_1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_2b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xd1,pcVar6);
              testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2b8);
              goto LAB_00344c81;
            }
          }
          else {
            qv = modelQuantization(*(Float *)((long)rgbPixels.ptr + lVar9 + local_2a8),local_29c);
            paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                      *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        ptr;
            if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
                (float *)0x0) {
              paVar4 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        field_2;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar_1,"rgb[c]","qv",(float *)((long)paVar4 + lVar9),&qv);
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)local_2b8);
              pcVar6 = "";
              if (gtest_ar_1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_2b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xd4,pcVar6);
              testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_2b8);
LAB_00344c81:
              testing::internal::AssertHelper::~AssertHelper(&local_2b0);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_2b8);
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_1.message_);
          c_00 = c_00 + 1;
        }
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&gtest_ar_);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  (&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
        local_2a8 = local_2a8 + 0xc;
        uVar3 = local_298 + 1;
      }
      local_270 = local_270 + 0x54;
      lVar9 = local_1d0 + 1;
    }
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&bgrDesc.offset);
    pbrt::Image::~Image(&image);
    lVar9 = local_1d8 + 4;
  } while( true );
}

Assistant:

TEST(Image, GetSetBGR) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc bgrDesc = image.GetChannelDesc({"B", "G", "R"});
        EXPECT_TRUE(bool(bgrDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues bgr = image.GetChannels({x, y}, bgrDesc);
                EXPECT_EQ(rgb[0], bgr[2]);
                EXPECT_EQ(rgb[1], bgr[1]);
                EXPECT_EQ(rgb[2], bgr[0]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}